

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionSet::get
          (SelectionSet *__return_storage_ptr__,SelectionSet *this,
          vector<int,_std::allocator<int>_> *fromIndex,vector<int,_std::allocator<int>_> *toIndex)

{
  long lVar1;
  int i;
  long lVar2;
  _Bvector_base<std::allocator<bool>_> local_58;
  
  SelectionSet(__return_storage_ptr__);
  lVar1 = 0;
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    OpenMDBitSet::get((OpenMDBitSet *)&local_58,
                      (OpenMDBitSet *)
                      ((long)&(((this->bitsets_).
                                super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                                ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                              super__Bvector_base<std::allocator<bool>_> + lVar1),
                      (long)(fromIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar2],
                      (long)(toIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start[lVar2]);
    std::vector<bool,_std::allocator<bool>_>::operator=
              ((vector<bool,_std::allocator<bool>_> *)
               ((long)&(((__return_storage_ptr__->bitsets_).
                         super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                         ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                       super__Bvector_base<std::allocator<bool>_> + lVar1),
               (vector<bool,_std::allocator<bool>_> *)&local_58);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_58);
    lVar1 = lVar1 + 0x28;
  }
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionSet::get(std::vector<int> fromIndex,
                                 std::vector<int> toIndex) {
    SelectionSet result;

    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result.bitsets_[i] = bitsets_[i].get(fromIndex[i], toIndex[i]);

    return result;
  }